

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_pbe.c
# Opt level: O3

void pbe_lambda_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  pdVar1 = (double *)p->params;
  dVar2 = get_ext_param(p,ext_params,0);
  dVar3 = get_ext_param(p,ext_params,1);
  pdVar1[1] = dVar3;
  dVar3 = get_ext_param(p,ext_params,2);
  pdVar1[2] = dVar3;
  *pdVar1 = (double)(-(longdouble)1 +
                    (longdouble)((1.0 - 1.0 / dVar2) * dVar3 + 1.48 / dVar2) / _DAT_00f64330);
  return;
}

Assistant:

static void
pbe_lambda_set_ext_params(xc_func_type *p, const double *ext_params)
{
  const double lambda_1 = 1.48;

  gga_x_pbe_params *params;
  double lambda, N;

  assert(p != NULL && p->params != NULL);
  params = (gga_x_pbe_params *) (p->params);

  N              = get_ext_param(p, ext_params, 0);
  params->mu     = get_ext_param(p, ext_params, 1);
  params->lambda = get_ext_param(p, ext_params, 2);

  lambda = (1.0 - 1.0/N)*params->lambda + lambda_1/N;
  params->kappa = lambda/M_CBRT2 - 1.0;
}